

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

bool slang::caseZWildcardEqual(SVInt *lhs,SVInt *rhs)

{
  uint32_t uVar1;
  uint64_t *puVar2;
  SVInt *in_RSI;
  long *in_RDI;
  uint64_t runknown;
  uint64_t lunknown;
  uint64_t mask;
  uint32_t i;
  uint32_t words;
  bool bothSigned;
  SVInt *in_stack_ffffffffffffff60;
  SVInt *in_stack_ffffffffffffff70;
  SVInt *this;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  byte local_71;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  uint local_58;
  SVInt local_50;
  SVInt *in_stack_ffffffffffffffc0;
  SVInt *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffe0;
  bool local_1;
  
  if (((*(byte *)((long)in_RDI + 0xd) & 1) == 0) &&
     (((in_RSI->super_SVIntStorage).unknownFlag & 1U) == 0)) {
    local_1 = exactlyEqual(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  }
  else if (*(bitwidth_t *)(in_RDI + 1) == (in_RSI->super_SVIntStorage).bitWidth) {
    uVar1 = SVInt::getNumWords((in_RSI->super_SVIntStorage).bitWidth,false);
    for (local_58 = 0; local_58 < uVar1; local_58 = local_58 + 1) {
      local_60 = 0xffffffffffffffff;
      local_68 = 0;
      if ((*(byte *)((long)in_RDI + 0xd) & 1) != 0) {
        local_68 = *(ulong *)(*in_RDI + (ulong)(local_58 + uVar1) * 8) &
                   (*(ulong *)(*in_RDI + (ulong)local_58 * 8) ^ 0xffffffffffffffff);
        local_60 = *(ulong *)(*in_RDI + (ulong)(local_58 + uVar1) * 8) &
                   *(ulong *)(*in_RDI + (ulong)local_58 * 8) ^ 0xffffffffffffffff;
      }
      local_70 = 0;
      if (((in_RSI->super_SVIntStorage).unknownFlag & 1U) != 0) {
        local_70 = (in_RSI->super_SVIntStorage).field_0.pVal[local_58 + uVar1] &
                   ((in_RSI->super_SVIntStorage).field_0.pVal[local_58] ^ 0xffffffffffffffff);
        local_60 = ((in_RSI->super_SVIntStorage).field_0.pVal[local_58 + uVar1] &
                    (in_RSI->super_SVIntStorage).field_0.pVal[local_58] ^ 0xffffffffffffffff) &
                   local_60;
      }
      puVar2 = SVInt::getRawData(in_stack_ffffffffffffff60);
      in_stack_ffffffffffffff60 = (SVInt *)(puVar2[local_58] & local_60);
      puVar2 = SVInt::getRawData(in_stack_ffffffffffffff60);
      if ((in_stack_ffffffffffffff60 != (SVInt *)(puVar2[local_58] & local_60)) ||
         ((local_68 & local_60) != (local_70 & local_60))) {
        return false;
      }
    }
    local_1 = true;
  }
  else {
    local_71 = 0;
    if ((*(byte *)((long)in_RDI + 0xc) & 1) != 0) {
      local_71 = (in_RSI->super_SVIntStorage).signFlag;
    }
    local_71 = local_71 & 1;
    if (*(uint *)(in_RDI + 1) < (in_RSI->super_SVIntStorage).bitWidth) {
      SVInt::extend((SVInt *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                    (bitwidth_t)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                    SUB81((ulong)in_stack_ffffffffffffff70 >> 0x18,0));
      local_1 = caseZWildcardEqual(in_RSI,(SVInt *)CONCAT17(local_71,in_stack_ffffffffffffffe0));
      SVInt::~SVInt(in_stack_ffffffffffffff70);
    }
    else {
      this = &local_50;
      SVInt::extend((SVInt *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                    (bitwidth_t)((ulong)this >> 0x20),SUB81((ulong)this >> 0x18,0));
      local_1 = caseZWildcardEqual(in_RSI,(SVInt *)CONCAT17(local_71,in_stack_ffffffffffffffe0));
      SVInt::~SVInt(this);
    }
  }
  return local_1;
}

Assistant:

bool caseZWildcardEqual(const SVInt& lhs, const SVInt& rhs) {
    // if no unknown flags, do normal comparison
    if (!lhs.unknownFlag && !rhs.unknownFlag)
        return exactlyEqual(lhs, rhs);

    // handle sign extension if necessary
    if (lhs.bitWidth != rhs.bitWidth) {
        bool bothSigned = lhs.signFlag && rhs.signFlag;
        if (lhs.bitWidth < rhs.bitWidth)
            return caseZWildcardEqual(lhs.extend(rhs.bitWidth, bothSigned), rhs);
        else
            return caseZWildcardEqual(lhs, rhs.extend(lhs.bitWidth, bothSigned));
    }

    uint32_t words = SVInt::getNumWords(rhs.bitWidth, false);
    for (uint32_t i = 0; i < words; ++i) {
        // bitmask to avoid comparing the Z bits on either side
        uint64_t mask = UINT64_MAX;

        uint64_t lunknown = 0;
        if (lhs.unknownFlag) {
            lunknown = lhs.pVal[i + words] & ~lhs.pVal[i];
            mask &= ~(lhs.pVal[i + words] & lhs.pVal[i]);
        }

        uint64_t runknown = 0;
        if (rhs.unknownFlag) {
            runknown = rhs.pVal[i + words] & ~rhs.pVal[i];
            mask &= ~(rhs.pVal[i + words] & rhs.pVal[i]);
        }

        if ((lhs.getRawData()[i] & mask) != (rhs.getRawData()[i] & mask) ||
            (lunknown & mask) != (runknown & mask)) {
            return false;
        }
    }

    return true;
}